

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxgeometsc.hpp
# Opt level: O0

double soplex::computeScalingVec<double>
                 (SVSetBase<double> *vecset,vector<double,_std::allocator<double>_> *coScaleval,
                 vector<double,_std::allocator<double>_> *scaleval,double epsilon)

{
  double dVar1;
  bool bVar2;
  int iVar3;
  SVectorBase<double> *this;
  undefined8 *puVar4;
  double *pdVar5;
  char *pcVar6;
  const_reference pvVar7;
  reference pvVar8;
  undefined4 in_EDX;
  int __c;
  undefined4 in_register_00000014;
  vector<double,_std::allocator<double>_> *in_RSI;
  SVSetBase<double> *pSVar9;
  Real RVar10;
  double p;
  double x;
  int j;
  double mini;
  double maxi;
  SVectorBase<double> *vec;
  int i;
  double pmax;
  double in_stack_ffffffffffffff78;
  SVSetBase<double> *in_stack_ffffffffffffff80;
  uint local_4c;
  SVSetBase<double> *local_48;
  SVSetBase<double> *local_40;
  uint local_2c;
  double local_28;
  
  local_28 = 0.0;
  for (local_2c = 0; iVar3 = SVSetBase<double>::num((SVSetBase<double> *)0x13f2e5),
      (int)local_2c < iVar3; local_2c = local_2c + 1) {
    this = SVSetBase<double>::operator[]
                     (in_stack_ffffffffffffff80,(int)((ulong)in_stack_ffffffffffffff78 >> 0x20));
    local_40 = (SVSetBase<double> *)0x0;
    puVar4 = (undefined8 *)infinity();
    local_48 = (SVSetBase<double> *)*puVar4;
    for (local_4c = 0; iVar3 = SVectorBase<double>::size(this), (int)local_4c < iVar3;
        local_4c = local_4c + 1) {
      pdVar5 = SVectorBase<double>::value(this,local_4c);
      dVar1 = *pdVar5;
      pcVar6 = SVectorBase<double>::index(this,(char *)(ulong)local_4c,__c);
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                         (in_RSI,(ulong)pcVar6 & 0xffffffff);
      pSVar9 = (SVSetBase<double> *)spxAbs<double>(dVar1 * *pvVar7);
      bVar2 = isZero<double,double>((double)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      if (!bVar2) {
        if ((double)local_40 < (double)pSVar9) {
          local_40 = pSVar9;
        }
        if ((double)pSVar9 < (double)local_48) {
          local_48 = pSVar9;
        }
      }
    }
    in_stack_ffffffffffffff80 = local_48;
    pdVar5 = (double *)infinity();
    if ((((double)in_stack_ffffffffffffff80 == *pdVar5) &&
        (!NAN((double)in_stack_ffffffffffffff80) && !NAN(*pdVar5))) ||
       (((double)local_40 == 0.0 && (!NAN((double)local_40))))) {
      local_48 = (SVSetBase<double> *)0x3ff0000000000000;
      local_40 = (SVSetBase<double> *)0x3ff0000000000000;
    }
    RVar10 = spxSqrt(6.46109407692432e-318);
    in_stack_ffffffffffffff78 = 1.0 / RVar10;
    pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)
                        CONCAT44(in_register_00000014,in_EDX),(ulong)local_2c);
    *pvVar8 = in_stack_ffffffffffffff78;
    if (local_28 < (double)local_40 / (double)local_48) {
      local_28 = (double)local_40 / (double)local_48;
    }
  }
  return local_28;
}

Assistant:

static R computeScalingVec(
   const SVSetBase<R>*   vecset, const std::vector<R>& coScaleval,
   std::vector<R>&       scaleval, R epsilon)
{
   R pmax = 0.0;

   assert(scaleval.size() == unsigned(vecset->num()));

   for(int i = 0; i < vecset->num(); ++i)
   {
      const SVectorBase<R>& vec = (*vecset)[i];

      R maxi = 0.0;
      R mini = R(infinity);

      for(int j = 0; j < vec.size(); ++j)
      {
         const R x = spxAbs(vec.value(j) * coScaleval[unsigned(vec.index(j))]);

         if(!isZero(x, epsilon))
         {
            if(x > maxi)
               maxi = x;

            if(x < mini)
               mini = x;
         }
      }

      // empty rows/cols are possible
      if(mini == R(infinity) || maxi == 0.0)
      {
         mini = 1.0;
         maxi = 1.0;
      }

      assert(mini < R(infinity));
      assert(maxi > 0.0);

      scaleval[unsigned(i)] = 1.0 / spxSqrt(mini * maxi);

      const R p = maxi / mini;

      if(p > pmax)
         pmax = p;
   }

   return pmax;
}